

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpReader.cpp
# Opt level: O3

void __thiscall OpenMD::DumpReader::readFrame(DumpReader *this,int whichFrame)

{
  uint uVar1;
  uint uVar2;
  SnapshotManager *pSVar3;
  byte bVar4;
  bool bVar5;
  Thermo thermo;
  Vector3d com;
  Vector3d comvel;
  Thermo local_70;
  Vector3d local_68;
  Vector3d local_48;
  Vector3d local_28;
  
  if (this->isScanned_ == false) {
    scanFile(this);
  }
  pSVar3 = this->info_->sman_;
  uVar1 = pSVar3->atomStorageLayout_;
  uVar2 = pSVar3->rigidBodyStorageLayout_;
  bVar4 = (byte)uVar2 | (byte)uVar1;
  this->needPos_ = (bool)(bVar4 & 1);
  bVar5 = true;
  if ((uVar2 & 0x408) == 0 && (uVar1 & 0xc08) == 0) {
    bVar5 = (bool)((byte)(uVar2 >> 0xb) & 1);
  }
  this->needVel_ = (bool)(bVar4 >> 1 & 1);
  this->needQuaternion_ = bVar5;
  this->needAngMom_ = (bool)(bVar4 >> 4 & 1);
  this->readField_ = (bool)((byte)(uVar1 >> 0xc) & 1);
  readSet(this,whichFrame);
  if (this->needCOMprops_ == true) {
    local_70.info_ = this->info_;
    local_68.super_Vector<double,_3U>.data_[0] = 0.0;
    local_68.super_Vector<double,_3U>.data_[1] = 0.0;
    local_68.super_Vector<double,_3U>.data_[2] = 0.0;
    if ((this->needPos_ == true) && (this->needVel_ == true)) {
      local_48.super_Vector<double,_3U>.data_[0] = 0.0;
      local_48.super_Vector<double,_3U>.data_[1] = 0.0;
      local_48.super_Vector<double,_3U>.data_[2] = 0.0;
      Thermo::getComAll(&local_70,&local_68,&local_48);
      Thermo::getAngularMomentum(&local_28,&local_70);
    }
    else {
      Thermo::getCom(&local_68,&local_70);
    }
  }
  return;
}

Assistant:

void DumpReader::readFrame(int whichFrame) {
    if (!isScanned_) scanFile();

    int asl  = info_->getSnapshotManager()->getAtomStorageLayout();
    int rbsl = info_->getSnapshotManager()->getRigidBodyStorageLayout();

    needPos_ =
        (asl & DataStorage::dslPosition || rbsl & DataStorage::dslPosition) ?
            true :
            false;
    needVel_ =
        (asl & DataStorage::dslVelocity || rbsl & DataStorage::dslVelocity) ?
            true :
            false;
    needQuaternion_ =
        (asl & DataStorage::dslAmat || asl & DataStorage::dslDipole ||
         asl & DataStorage::dslQuadrupole || rbsl & DataStorage::dslAmat ||
         rbsl & DataStorage::dslDipole || rbsl & DataStorage::dslQuadrupole) ?
            true :
            false;
    needAngMom_ = (asl & DataStorage::dslAngularMomentum ||
                   rbsl & DataStorage::dslAngularMomentum) ?
                      true :
                      false;

    // some dump files contain the efield, but we should only parse
    // and set the field if we have actually allocated memory for it
    readField_ = (asl & DataStorage::dslElectricField) ? true : false;

    readSet(whichFrame);

    if (needCOMprops_) {
      Thermo thermo(info_);
      Vector3d com;

      if (needPos_ && needVel_) {
        Vector3d comvel;
        Vector3d comw;
        thermo.getComAll(com, comvel);
        comw = thermo.getAngularMomentum();
      } else {
        com = thermo.getCom();
      }
    }
  }